

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O3

void __thiscall
cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::deallocate
          (MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this,void *ptr,
          size_type size)

{
  MemChunk *chunk;
  byte bVar1;
  ulong uVar2;
  undefined4 *puVar3;
  char *pcVar4;
  ulong uVar5;
  MemChunk *pMVar6;
  SmallMemChunk *curr;
  MemChunk *pMVar7;
  ulong uVar8;
  size_type *psVar9;
  byte bVar10;
  ulong uVar11;
  
  if (ptr == (void *)0x0) {
    return;
  }
  uVar2 = *(ulong *)((long)ptr + -8);
  if ((uVar2 & 1) == 0) {
    puVar3 = (undefined4 *)__cxa_allocate_exception(0x10);
    *puVar3 = 2;
    pcVar4 = "potentially freeing an unused pointer";
    goto LAB_00103600;
  }
  chunk = (MemChunk *)((long)ptr + -0x10);
  uVar5 = uVar2 & 0xfffffffffffffff0;
  if (this->m_padding == false) {
    if ((uVar2 & 2) == 0) goto LAB_00103536;
LAB_0010352b:
    if ('\0' < *(char *)((long)ptr + (uVar5 - 0x11))) {
LAB_00103536:
      *(ulong *)((long)ptr + -8) = uVar5;
      *(ulong *)((long)ptr + (uVar5 - 0x10)) = uVar5;
      if (uVar2 < 0x100) {
        pMVar7 = *(MemChunk **)((long)&this->m_smallLists[0].m_head + uVar5);
        if (pMVar7 == (MemChunk *)0x0) {
          psVar9 = (size_type *)((long)&this->m_smallLists[0].m_head + uVar5);
          pMVar6 = chunk;
          pMVar7 = chunk;
        }
        else {
          pMVar6 = (MemChunk *)pMVar7[1].m_prevFootSize;
          pMVar7[1].m_prevFootSize = (size_type)chunk;
          psVar9 = &pMVar6[1].m_size;
        }
        *psVar9 = (size_type)chunk;
        *(MemChunk **)ptr = pMVar6;
        *(MemChunk **)((long)ptr + 8) = pMVar7;
        if ((this->m_smallMap >> ((uint)(uVar5 >> 3) & 0x1f) & 1) == 0) {
          this->m_smallMap = this->m_smallMap | 1 << ((byte)(uVar5 >> 3) & 0x1f);
        }
        return;
      }
      addLargeChunk(this,chunk);
      return;
    }
LAB_001035d0:
    puVar3 = (undefined4 *)__cxa_allocate_exception(0x10);
    *puVar3 = 3;
    pcVar4 = "Invalid padding byte value";
  }
  else {
    if ((0x10 < uVar5) && ((uVar2 & 2) != 0)) {
      bVar1 = *(byte *)((long)ptr + (uVar5 - 0x11));
      uVar8 = (ulong)(char)bVar1;
      if ((long)uVar8 < 1) goto LAB_001035d0;
      if ((uVar8 <= uVar5) && (*(byte *)((long)ptr + (uVar5 - 0x11)) == bVar1)) {
        if (bVar1 != 1) {
          bVar10 = 9;
          if (bVar1 < 9) {
            bVar10 = bVar1;
          }
          uVar11 = 0;
          do {
            if (*(char *)((long)chunk + uVar11 + (uVar5 - uVar8)) != this->m_paddingByte) {
              puVar3 = (undefined4 *)__cxa_allocate_exception(0x10);
              *puVar3 = 3;
              pcVar4 = "padding byte got modified.";
              goto LAB_00103600;
            }
            uVar11 = uVar11 + 1;
          } while ((byte)(bVar10 - 1) != uVar11);
        }
        goto LAB_0010352b;
      }
    }
    puVar3 = (undefined4 *)__cxa_allocate_exception(0x10);
    *puVar3 = 1;
    pcVar4 = "assertion failure.";
  }
LAB_00103600:
  *(char **)(puVar3 + 2) = pcVar4;
  __cxa_throw(puVar3,&Exception::typeinfo,0);
}

Assistant:

void
    deallocate (T* ptr, size_type size = 0)
    {
        if (ptr != nullptr)
        {
            MemChunk* chunk = mem2Chunk (ptr);
            if (!chunk->isUsed())
            {
                throw Exception (MEM_ERROR_DOUBLE_FREE, "potentially freeing an unused pointer");
            }
            size_type chunkSize = chunk->getChunkSize ();
            if (m_padding)
            {
                COOKMEM_ASSERT (chunkSize > CHUNK_OVERHEAD);
                size_type userSize = chunk->getUserSize () + CHUNK_OVERHEAD;
                COOKMEM_ASSERT (userSize < chunkSize);
                char diff = (char)(chunkSize - userSize);
                COOKMEM_ASSERT ((diff > 0) && ((userSize + diff) == chunkSize));
                COOKMEM_ASSERT (*(((char*)chunk) + chunkSize - 1) == diff);

                char* paddingPtr = ((char*)chunk) + userSize;
                --diff;
                if (diff > 8)
                {
                    diff = 8;
                }
                for (int i = 0; i < diff; ++i)
                {
                    if (paddingPtr[i] != m_paddingByte)
                    {
                        throw Exception (MEM_ERROR_PADDING, "padding byte got modified.");
                    }
                }
            }
            m_logger.logDeallocation (ptr, chunk->getUserSize ());

            chunk->setFreeChunkSize (chunkSize);
            addChunk (chunk);
        }
        else
        {
            m_logger.logDeallocation (ptr, size);
        }
    }